

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture2DShader::setUniforms
          (Texture2DShader *this,Context *gl,deUint32 program)

{
  uint uVar1;
  int local_d8;
  allocator<char> local_d1;
  string scaleName;
  string biasName;
  string samplerName;
  string local_70;
  string local_50;
  
  (*gl->_vptr_Context[0x76])(gl,(ulong)program);
  local_d8 = 0;
  while( true ) {
    if ((int)(((long)(this->m_inputs).
                     super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_inputs).
                    super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x24) <= local_d8) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scaleName,"u_sampler",(allocator<char> *)&local_50);
    de::toString<int>(&biasName,&local_d8);
    std::operator+(&samplerName,&scaleName,&biasName);
    std::__cxx11::string::~string((string *)&biasName);
    std::__cxx11::string::~string((string *)&scaleName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&biasName,"u_texScale",(allocator<char> *)&local_70);
    de::toString<int>(&local_50,&local_d8);
    std::operator+(&scaleName,&biasName,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&biasName);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"u_texBias",&local_d1);
    de::toString<int>(&local_70,&local_d8);
    std::operator+(&biasName,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,samplerName._M_dataplus._M_p);
    (*gl->_vptr_Context[0x5b])
              (gl,(ulong)uVar1,
               (ulong)(uint)(this->m_inputs).
                            super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_d8].unitNdx);
    uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,scaleName._M_dataplus._M_p);
    (*gl->_vptr_Context[0x5f])
              (gl,(ulong)uVar1,1,
               &(this->m_inputs).
                super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                ._M_impl.super__Vector_impl_data._M_start[local_d8].scale);
    uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,biasName._M_dataplus._M_p);
    (*gl->_vptr_Context[0x5f])
              (gl,(ulong)uVar1,1,
               &(this->m_inputs).
                super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                ._M_impl.super__Vector_impl_data._M_start[local_d8].bias);
    std::__cxx11::string::~string((string *)&biasName);
    std::__cxx11::string::~string((string *)&scaleName);
    std::__cxx11::string::~string((string *)&samplerName);
    local_d8 = local_d8 + 1;
  }
  uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,"u_outScale0");
  (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar1,1,&this->m_outScale);
  uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,"u_outBias0");
  (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar1,1,&this->m_outBias);
  return;
}

Assistant:

void Texture2DShader::setUniforms (sglr::Context& gl, deUint32 program) const
{
	gl.useProgram(program);

	for (int texNdx = 0; texNdx < (int)m_inputs.size(); texNdx++)
	{
		string	samplerName	= string("u_sampler") + de::toString(texNdx);
		string	scaleName	= string("u_texScale") + de::toString(texNdx);
		string	biasName	= string("u_texBias") + de::toString(texNdx);

		gl.uniform1i(gl.getUniformLocation(program, samplerName.c_str()), m_inputs[texNdx].unitNdx);
		gl.uniform4fv(gl.getUniformLocation(program, scaleName.c_str()), 1, m_inputs[texNdx].scale.getPtr());
		gl.uniform4fv(gl.getUniformLocation(program, biasName.c_str()), 1, m_inputs[texNdx].bias.getPtr());
	}

	gl.uniform4fv(gl.getUniformLocation(program, "u_outScale0"), 1, m_outScale.getPtr());
	gl.uniform4fv(gl.getUniformLocation(program, "u_outBias0"), 1, m_outBias.getPtr());
}